

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_write(_garray *x,t_symbol *filename)

{
  int iVar1;
  _glist *x_00;
  _glist *x_01;
  FILE *__stream;
  long lVar2;
  int yonset;
  int elemsize;
  char buf [1000];
  int local_420;
  int local_41c;
  char local_418 [1000];
  
  x_00 = (_glist *)garray_getarray_floatonly(x,&local_420,&local_41c);
  if (x_00 == (_glist *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
    return;
  }
  x_01 = glist_getcanvas(x_00);
  canvas_makefilename(x_01,filename->s_name,local_418,1000);
  __stream = (FILE *)sys_fopen(local_418,"w");
  if (__stream == (FILE *)0x0) {
    pd_error((void *)0x0,"%s: can\'t create",local_418);
  }
  else {
    if (0 < *(int *)&(x_00->gl_obj).te_g.g_pd) {
      lVar2 = 0;
      do {
        iVar1 = fprintf(__stream,"%g\n",
                        (double)*(float *)((long)&((x_00->gl_obj).te_g.g_next)->g_pd +
                                          lVar2 * 8 + (long)local_420));
        if (iVar1 < 1) {
          post("%s: write error",filename->s_name);
          break;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < *(int *)&(x_00->gl_obj).te_g.g_pd);
    }
    fclose(__stream);
  }
  return;
}

Assistant:

static void garray_write(t_garray *x, t_symbol *filename)
{
    FILE *fd;
    char buf[MAXPDSTRING];
    int yonset, elemsize, i;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    canvas_makefilename(glist_getcanvas(x->x_glist), filename->s_name,
        buf, MAXPDSTRING);
    if (!(fd = sys_fopen(buf, "w")))
    {
        pd_error(0, "%s: can't create", buf);
        return;
    }
    for (i = 0; i < array->a_n; i++)
    {
        if (fprintf(fd, "%g\n",
            *(t_float *)(((array->a_vec + sizeof(t_word) * i)) + yonset)) < 1)
        {
            post("%s: write error", filename->s_name);
            break;
        }
    }
    fclose(fd);
}